

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O2

void mserialize::detail::BuiltinSerializer<binlog::ArrayView<int>,_void>::
     serialize_elems<binlog::detail::QueueWriter>
               (undefined8 *param_1,undefined8 param_2,long param_3)

{
  undefined4 *puVar1;
  int *elem;
  undefined4 *puVar2;
  ArrayView<int> *__range3;
  
  puVar1 = (undefined4 *)param_1[1];
  for (puVar2 = (undefined4 *)*param_1; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    **(undefined4 **)(param_3 + 8) = *puVar2;
    *(long *)(param_3 + 8) = *(long *)(param_3 + 8) + 4;
  }
  return;
}

Assistant:

const T* begin() const { return _begin; }